

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QCommonArrayOps<QToolBarAreaLayoutItem>::growAppend
          (QCommonArrayOps<QToolBarAreaLayoutItem> *this,QToolBarAreaLayoutItem *b,
          QToolBarAreaLayoutItem *e)

{
  long n;
  QToolBarAreaLayoutItem *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QToolBarAreaLayoutItem> local_48;
  QToolBarAreaLayoutItem *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = b;
  if (b != e) {
    n = ((long)e - (long)b >> 3) * -0x5555555555555555;
    local_48.d = (Data *)0x0;
    local_48.ptr = (QToolBarAreaLayoutItem *)0x0;
    local_48.size = 0;
    pQVar1 = (this->super_Type).super_QArrayDataPointer<QToolBarAreaLayoutItem>.ptr;
    if ((b < pQVar1) ||
       (pQVar1 + (this->super_Type).super_QArrayDataPointer<QToolBarAreaLayoutItem>.size <= b)) {
      QArrayDataPointer<QToolBarAreaLayoutItem>::detachAndGrow
                ((QArrayDataPointer<QToolBarAreaLayoutItem> *)this,GrowsAtEnd,n,
                 (QToolBarAreaLayoutItem **)0x0,(QArrayDataPointer<QToolBarAreaLayoutItem> *)0x0);
      pQVar1 = b;
    }
    else {
      QArrayDataPointer<QToolBarAreaLayoutItem>::detachAndGrow
                ((QArrayDataPointer<QToolBarAreaLayoutItem> *)this,GrowsAtEnd,n,&local_28,&local_48)
      ;
      pQVar1 = local_28;
    }
    QPodArrayOps<QToolBarAreaLayoutItem>::copyAppend
              (&this->super_Type,pQVar1,
               (QToolBarAreaLayoutItem *)(((long)e - (long)b) + (long)pQVar1));
    if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d)->super_QArrayData,0x18,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }